

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMemCheckHandler.cxx
# Opt level: O3

bool __thiscall
cmCTestMemCheckHandler::ProcessMemCheckSanitizerOutput
          (cmCTestMemCheckHandler *this,string *str,string *log,
          vector<int,_std::allocator<int>_> *result)

{
  int *piVar1;
  iterator __position;
  pointer pbVar2;
  pointer pbVar3;
  bool bVar4;
  uint uVar5;
  long *plVar6;
  size_type sVar7;
  ostream *poVar8;
  ulong *puVar9;
  pointer pbVar10;
  int iVar11;
  string resultFound;
  string regex;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines;
  RegularExpression leakWarning;
  RegularExpression sanitizerWarning;
  ostringstream ostr;
  ulong *local_400;
  long local_3f8;
  ulong local_3f0;
  long lStack_3e8;
  string local_3e0;
  cmCTestMemCheckHandler *local_3c0;
  undefined1 *local_3b8;
  undefined8 local_3b0;
  undefined1 local_3a8;
  undefined7 uStack_3a7;
  char *local_398;
  undefined8 local_390;
  char local_388;
  undefined7 uStack_387;
  string *local_378;
  vector<int,_std::allocator<int>_> *local_370;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_368;
  RegularExpression local_348;
  RegularExpression local_278;
  undefined1 local_1a8 [376];
  
  local_398 = &local_388;
  local_390 = 0;
  local_388 = '\0';
  uVar5 = this->MemoryTesterStyle - 6;
  local_3c0 = this;
  if ((uVar5 < 5) && ((0x1dU >> (uVar5 & 0x1f) & 1) != 0)) {
    std::__cxx11::string::_M_replace
              ((ulong)&local_398,0,(char *)0x0,
               (ulong)(&DAT_00742270 + *(int *)(&DAT_00742270 + (ulong)uVar5 * 4)));
  }
  local_278.regmust = (char *)0x0;
  local_278.program = (char *)0x0;
  local_278.progsize = 0;
  memset(&local_278,0,0xaa);
  cmsys::RegularExpression::compile(&local_278,local_398);
  local_348.regmust = (char *)0x0;
  local_348.program = (char *)0x0;
  local_348.progsize = 0;
  memset(&local_348,0,0xaa);
  cmsys::RegularExpression::compile(&local_348,"(Direct|Indirect) leak of .*");
  local_368.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_368.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_368.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmsys::SystemTools::Split(str,&local_368);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  pbVar3 = local_368.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  log->_M_string_length = 0;
  *(log->_M_dataplus)._M_p = '\0';
  iVar11 = 0;
  local_378 = log;
  if (local_368.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_368.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar10 = local_368.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_370 = result;
    do {
      local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
      local_3e0._M_string_length = 0;
      local_3e0.field_2._M_local_buf[0] = '\0';
      bVar4 = cmsys::RegularExpression::find
                        (&local_348,(pbVar10->_M_dataplus)._M_p,&local_348.regmatch);
      if (bVar4) {
        if (local_348.regmatch.startp[1] == (char *)0x0) {
          local_3b8 = &local_3a8;
          local_3b0 = 0;
          local_3a8 = 0;
        }
        else {
          local_3b8 = &local_3a8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_3b8,local_348.regmatch.startp[1],local_348.regmatch.endp[1]);
        }
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_3b8);
        puVar9 = (ulong *)(plVar6 + 2);
        if ((ulong *)*plVar6 == puVar9) {
          local_3f0 = *puVar9;
          lStack_3e8 = plVar6[3];
          local_400 = &local_3f0;
        }
        else {
          local_3f0 = *puVar9;
          local_400 = (ulong *)*plVar6;
        }
        local_3f8 = plVar6[1];
        *plVar6 = (long)puVar9;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        std::__cxx11::string::operator=((string *)&local_3e0,(string *)&local_400);
        if (local_400 != &local_3f0) {
          operator_delete(local_400,local_3f0 + 1);
        }
        if (local_3b8 != &local_3a8) {
          operator_delete(local_3b8,CONCAT71(uStack_3a7,local_3a8) + 1);
        }
      }
      else {
        bVar4 = cmsys::RegularExpression::find
                          (&local_278,(pbVar10->_M_dataplus)._M_p,&local_278.regmatch);
        if (bVar4) {
          if (local_278.regmatch.startp[1] == (char *)0x0) {
            local_400 = &local_3f0;
            local_3f8 = 0;
            local_3f0 = local_3f0 & 0xffffffffffffff00;
          }
          else {
            local_400 = &local_3f0;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_400,local_278.regmatch.startp[1],local_278.regmatch.endp[1])
            ;
          }
          std::__cxx11::string::operator=((string *)&local_3e0,(string *)&local_400);
          result = local_370;
          if (local_400 != &local_3f0) {
            operator_delete(local_400,local_3f0 + 1);
            result = local_370;
          }
        }
      }
      if (local_3e0._M_string_length != 0) {
        sVar7 = FindOrAddWarning(local_3c0,&local_3e0);
        piVar1 = (result->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        __position._M_current =
             (result->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_finish;
        if ((piVar1 == __position._M_current) ||
           (((long)__position._M_current - (long)piVar1 >> 2) - 1U < sVar7)) {
          local_400 = (ulong *)CONCAT44(local_400._4_4_,1);
          if (__position._M_current ==
              (result->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (result,__position,(int *)&local_400);
          }
          else {
            *__position._M_current = 1;
            (result->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_finish = __position._M_current + 1;
          }
        }
        else {
          piVar1[sVar7] = piVar1[sVar7] + 1;
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"<b>",3);
        pbVar2 = (local_3c0->ResultStrings).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,pbVar2[sVar7]._M_dataplus._M_p,
                            pbVar2[sVar7]._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"</b> ",5);
        iVar11 = iVar11 + 1;
      }
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,(pbVar10->_M_dataplus)._M_p,pbVar10->_M_string_length
                         );
      std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
        operator_delete(local_3e0._M_dataplus._M_p,
                        CONCAT71(local_3e0.field_2._M_allocated_capacity._1_7_,
                                 local_3e0.field_2._M_local_buf[0]) + 1);
      }
      pbVar10 = pbVar10 + 1;
    } while (pbVar10 != pbVar3);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)local_378,(string *)&local_3e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
    operator_delete(local_3e0._M_dataplus._M_p,
                    CONCAT71(local_3e0.field_2._M_allocated_capacity._1_7_,
                             local_3e0.field_2._M_local_buf[0]) + 1);
  }
  local_3c0->DefectCount = local_3c0->DefectCount + iVar11;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_368);
  if (local_348.program != (char *)0x0) {
    operator_delete__(local_348.program);
  }
  if (local_278.program != (char *)0x0) {
    operator_delete__(local_278.program);
  }
  if (local_398 != &local_388) {
    operator_delete(local_398,CONCAT71(uStack_387,local_388) + 1);
  }
  return iVar11 == 0;
}

Assistant:

bool cmCTestMemCheckHandler::ProcessMemCheckSanitizerOutput(
  const std::string& str, std::string& log, std::vector<int>& result)
{
  std::string regex;
  switch (this->MemoryTesterStyle) {
    case cmCTestMemCheckHandler::ADDRESS_SANITIZER:
      regex = "ERROR: AddressSanitizer: (.*) on.*";
      break;
    case cmCTestMemCheckHandler::LEAK_SANITIZER:
      // use leakWarning regex
      break;
    case cmCTestMemCheckHandler::THREAD_SANITIZER:
      regex = "WARNING: ThreadSanitizer: (.*) \\(pid=.*\\)";
      break;
    case cmCTestMemCheckHandler::MEMORY_SANITIZER:
      regex = "WARNING: MemorySanitizer: (.*)";
      break;
    case cmCTestMemCheckHandler::UB_SANITIZER:
      regex = "runtime error: (.*)";
      break;
    default:
      break;
  }
  cmsys::RegularExpression sanitizerWarning(regex);
  cmsys::RegularExpression leakWarning("(Direct|Indirect) leak of .*");
  int defects = 0;
  std::vector<std::string> lines;
  cmsys::SystemTools::Split(str, lines);
  std::ostringstream ostr;
  log.clear();
  for (std::string const& l : lines) {
    std::string resultFound;
    if (leakWarning.find(l)) {
      resultFound = leakWarning.match(1) + " leak";
    } else if (sanitizerWarning.find(l)) {
      resultFound = sanitizerWarning.match(1);
    }
    if (!resultFound.empty()) {
      std::vector<int>::size_type idx = this->FindOrAddWarning(resultFound);
      if (result.empty() || idx > result.size() - 1) {
        result.push_back(1);
      } else {
        result[idx]++;
      }
      defects++;
      ostr << "<b>" << this->ResultStrings[idx] << "</b> ";
    }
    ostr << l << std::endl;
  }
  log = ostr.str();
  this->DefectCount += defects;
  return defects == 0;
}